

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int on_header(nghttp2_session *session,nghttp2_frame *frame,uint8_t *name,size_t namelen,
             uint8_t *value,size_t valuelen,uint8_t flags,void *userp)

{
  int32_t stream_id_00;
  long lVar1;
  int iVar2;
  CURLcode CVar3;
  Curl_easy *data;
  char *pcVar4;
  void *pvVar5;
  Curl_easy *local_c0;
  Curl_easy *local_b8;
  uint *local_b0;
  char local_a8 [8];
  char buffer [32];
  char **headp;
  char *check;
  int rc;
  char *h;
  CURLcode result;
  int32_t stream_id;
  Curl_easy *data_s;
  stream_ctx *stream;
  Curl_cfilter *cf;
  size_t valuelen_local;
  uint8_t *value_local;
  size_t namelen_local;
  uint8_t *name_local;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  stream_id_00 = (frame->hd).stream_id;
  data = (Curl_easy *)nghttp2_session_get_stream_user_data(session,stream_id_00);
  if (data == (Curl_easy *)0x0) {
    session_local._4_4_ = -0x386;
  }
  else {
    if ((data == (Curl_easy *)0x0) || ((data->req).p.file == (FILEPROTO *)0x0)) {
      local_b0 = (uint *)0x0;
    }
    else {
      local_b0 = (uint *)((data->req).p.http)->h2_ctx;
    }
    if (local_b0 == (uint *)0x0) {
      Curl_failf(data,"Internal NULL stream");
      session_local._4_4_ = -0x386;
    }
    else if ((frame->hd).type == '\x05') {
      iVar2 = strcmp(":authority",(char *)name);
      if (iVar2 == 0) {
        check._4_4_ = 0;
        pcVar4 = curl_maprintf("%s:%d",*(undefined8 *)(*(long *)((long)userp + 0x18) + 0x50),
                               (ulong)*(uint *)(*(long *)((long)userp + 0x18) + 0x46c));
        if (pcVar4 == (char *)0x0) {
          return -0x386;
        }
        iVar2 = curl_strequal(pcVar4,(char *)value);
        if ((iVar2 == 0) &&
           ((*(int *)(*(long *)((long)userp + 0x18) + 0x46c) !=
             *(int *)(*(long *)(*(long *)((long)userp + 0x18) + 0x2b0) + 0x80) ||
            (iVar2 = curl_strequal(*(char **)(*(long *)((long)userp + 0x18) + 0x50),(char *)value),
            iVar2 == 0)))) {
          nghttp2_submit_rst_stream(session,'\0',stream_id_00,1);
          check._4_4_ = -0x386;
        }
        (*Curl_cfree)(pcVar4);
        if (check._4_4_ != 0) {
          return check._4_4_;
        }
      }
      if (*(long *)(local_b0 + 0x4a) == 0) {
        local_b0[0x4e] = 10;
        local_b0[0x4f] = 0;
        pvVar5 = (*Curl_cmalloc)(*(long *)(local_b0 + 0x4e) << 3);
        *(void **)(local_b0 + 0x4a) = pvVar5;
        if (*(long *)(local_b0 + 0x4a) == 0) {
          return -0x209;
        }
        local_b0[0x4c] = 0;
        local_b0[0x4d] = 0;
      }
      else if (*(long *)(local_b0 + 0x4c) == *(long *)(local_b0 + 0x4e)) {
        if (1000 < *(ulong *)(local_b0 + 0x4e)) {
          Curl_failf(data,"Too many PUSH_PROMISE headers");
          (*Curl_cfree)(*(void **)(local_b0 + 0x4a));
          local_b0[0x4a] = 0;
          local_b0[0x4b] = 0;
          return -0x209;
        }
        *(long *)(local_b0 + 0x4e) = *(long *)(local_b0 + 0x4e) << 1;
        pvVar5 = Curl_saferealloc(*(void **)(local_b0 + 0x4a),*(long *)(local_b0 + 0x4e) << 3);
        if (pvVar5 == (void *)0x0) {
          local_b0[0x4a] = 0;
          local_b0[0x4b] = 0;
          return -0x209;
        }
        *(void **)(local_b0 + 0x4a) = pvVar5;
      }
      pcVar4 = curl_maprintf("%s:%s",name,value);
      if (pcVar4 != (char *)0x0) {
        lVar1 = *(long *)(local_b0 + 0x4c);
        *(long *)(local_b0 + 0x4c) = lVar1 + 1;
        *(char **)(*(long *)(local_b0 + 0x4a) + lVar1 * 8) = pcVar4;
      }
      session_local._4_4_ = 0;
    }
    else if ((local_b0[0x54] & 1) == 0) {
      if ((namelen == 7) && (iVar2 = memcmp(":status",name,7), iVar2 == 0)) {
        CVar3 = Curl_http_decode_status((int *)(local_b0 + 0x50),(char *)value,valuelen);
        if (CVar3 == CURLE_OK) {
          curl_msnprintf(local_a8,0x20,":status:%u\r",(ulong)local_b0[0x50]);
          CVar3 = Curl_headers_push(data,local_a8,'\x10');
          if (CVar3 == CURLE_OK) {
            CVar3 = recvbuf_write_hds((Curl_cfilter *)userp,data,"HTTP/2 ",7);
            if (CVar3 == CURLE_OK) {
              CVar3 = recvbuf_write_hds((Curl_cfilter *)userp,data,(char *)value,valuelen);
              if (CVar3 == CURLE_OK) {
                CVar3 = recvbuf_write_hds((Curl_cfilter *)userp,data," \r\n",3);
                if (CVar3 == CURLE_OK) {
                  if (userp == (void *)0x0) {
                    local_b8 = (Curl_easy *)0x0;
                  }
                  else {
                    local_b8 = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 0x10);
                  }
                  if (local_b8 != data) {
                    Curl_expire(data,0,EXPIRE_RUN_NOW);
                  }
                  if (((data != (Curl_easy *)0x0) &&
                      ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
                     ((userp != (void *)0x0 && (0 < *(int *)(*userp + 0xc))))) {
                    Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] status: HTTP/2 %03d",
                                      (ulong)*local_b0,(ulong)local_b0[0x50]);
                  }
                  session_local._4_4_ = 0;
                }
                else {
                  session_local._4_4_ = -0x386;
                }
              }
              else {
                session_local._4_4_ = -0x386;
              }
            }
            else {
              session_local._4_4_ = -0x386;
            }
          }
          else {
            session_local._4_4_ = -0x386;
          }
        }
        else {
          session_local._4_4_ = -0x386;
        }
      }
      else {
        CVar3 = recvbuf_write_hds((Curl_cfilter *)userp,data,(char *)name,namelen);
        if (CVar3 == CURLE_OK) {
          CVar3 = recvbuf_write_hds((Curl_cfilter *)userp,data,": ",2);
          if (CVar3 == CURLE_OK) {
            CVar3 = recvbuf_write_hds((Curl_cfilter *)userp,data,(char *)value,valuelen);
            if (CVar3 == CURLE_OK) {
              CVar3 = recvbuf_write_hds((Curl_cfilter *)userp,data,"\r\n",2);
              if (CVar3 == CURLE_OK) {
                if (userp == (void *)0x0) {
                  local_c0 = (Curl_easy *)0x0;
                }
                else {
                  local_c0 = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 0x10);
                }
                if (local_c0 != data) {
                  Curl_expire(data,0,EXPIRE_RUN_NOW);
                }
                if ((((data != (Curl_easy *)0x0) &&
                     ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
                    (userp != (void *)0x0)) && (0 < *(int *)(*userp + 0xc))) {
                  Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] header: %.*s: %.*s",
                                    (ulong)*local_b0,namelen & 0xffffffff,name,(int)valuelen,value);
                }
                session_local._4_4_ = 0;
              }
              else {
                session_local._4_4_ = -0x386;
              }
            }
            else {
              session_local._4_4_ = -0x386;
            }
          }
          else {
            session_local._4_4_ = -0x386;
          }
        }
        else {
          session_local._4_4_ = -0x386;
        }
      }
    }
    else {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
         ((userp != (void *)0x0 && (0 < *(int *)(*userp + 0xc))))) {
        Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] trailer: %.*s: %.*s",(ulong)*local_b0,
                          namelen & 0xffffffff,name,(int)valuelen,value);
      }
      CVar3 = Curl_dynhds_add((dynhds *)(local_b0 + 0x36),(char *)name,namelen,(char *)value,
                              valuelen);
      if (CVar3 == CURLE_OK) {
        session_local._4_4_ = 0;
      }
      else {
        session_local._4_4_ = -0x386;
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

static int on_header(nghttp2_session *session, const nghttp2_frame *frame,
                     const uint8_t *name, size_t namelen,
                     const uint8_t *value, size_t valuelen,
                     uint8_t flags,
                     void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct stream_ctx *stream;
  struct Curl_easy *data_s;
  int32_t stream_id = frame->hd.stream_id;
  CURLcode result;
  (void)flags;

  DEBUGASSERT(stream_id); /* should never be a zero stream ID here */

  /* get the stream from the hash based on Stream ID */
  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s)
    /* Receiving a Stream ID not in the hash should not happen, this is an
       internal error more than anything else! */
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  stream = H2_STREAM_CTX(data_s);
  if(!stream) {
    failf(data_s, "Internal NULL stream");
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  /* Store received PUSH_PROMISE headers to be used when the subsequent
     PUSH_PROMISE callback comes */
  if(frame->hd.type == NGHTTP2_PUSH_PROMISE) {
    char *h;

    if(!strcmp(HTTP_PSEUDO_AUTHORITY, (const char *)name)) {
      /* pseudo headers are lower case */
      int rc = 0;
      char *check = aprintf("%s:%d", cf->conn->host.name,
                            cf->conn->remote_port);
      if(!check)
        /* no memory */
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      if(!strcasecompare(check, (const char *)value) &&
         ((cf->conn->remote_port != cf->conn->given->defport) ||
          !strcasecompare(cf->conn->host.name, (const char *)value))) {
        /* This is push is not for the same authority that was asked for in
         * the URL. RFC 7540 section 8.2 says: "A client MUST treat a
         * PUSH_PROMISE for which the server is not authoritative as a stream
         * error of type PROTOCOL_ERROR."
         */
        (void)nghttp2_submit_rst_stream(session, NGHTTP2_FLAG_NONE,
                                        stream_id, NGHTTP2_PROTOCOL_ERROR);
        rc = NGHTTP2_ERR_CALLBACK_FAILURE;
      }
      free(check);
      if(rc)
        return rc;
    }

    if(!stream->push_headers) {
      stream->push_headers_alloc = 10;
      stream->push_headers = malloc(stream->push_headers_alloc *
                                    sizeof(char *));
      if(!stream->push_headers)
        return NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE;
      stream->push_headers_used = 0;
    }
    else if(stream->push_headers_used ==
            stream->push_headers_alloc) {
      char **headp;
      if(stream->push_headers_alloc > 1000) {
        /* this is beyond crazy many headers, bail out */
        failf(data_s, "Too many PUSH_PROMISE headers");
        Curl_safefree(stream->push_headers);
        return NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE;
      }
      stream->push_headers_alloc *= 2;
      headp = Curl_saferealloc(stream->push_headers,
                               stream->push_headers_alloc * sizeof(char *));
      if(!headp) {
        stream->push_headers = NULL;
        return NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE;
      }
      stream->push_headers = headp;
    }
    h = aprintf("%s:%s", name, value);
    if(h)
      stream->push_headers[stream->push_headers_used++] = h;
    return 0;
  }

  if(stream->bodystarted) {
    /* This is a trailer */
    CURL_TRC_CF(data_s, cf, "[%d] trailer: %.*s: %.*s",
                stream->id, (int)namelen, name, (int)valuelen, value);
    result = Curl_dynhds_add(&stream->resp_trailers,
                             (const char *)name, namelen,
                             (const char *)value, valuelen);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    return 0;
  }

  if(namelen == sizeof(HTTP_PSEUDO_STATUS) - 1 &&
     memcmp(HTTP_PSEUDO_STATUS, name, namelen) == 0) {
    /* nghttp2 guarantees :status is received first and only once. */
    char buffer[32];
    result = Curl_http_decode_status(&stream->status_code,
                                     (const char *)value, valuelen);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    msnprintf(buffer, sizeof(buffer), HTTP_PSEUDO_STATUS ":%u\r",
              stream->status_code);
    result = Curl_headers_push(data_s, buffer, CURLH_PSEUDO);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    result = recvbuf_write_hds(cf, data_s, STRCONST("HTTP/2 "));
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    result = recvbuf_write_hds(cf, data_s, (const char *)value, valuelen);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    /* the space character after the status code is mandatory */
    result = recvbuf_write_hds(cf, data_s, STRCONST(" \r\n"));
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    /* if we receive data for another handle, wake that up */
    if(CF_DATA_CURRENT(cf) != data_s)
      Curl_expire(data_s, 0, EXPIRE_RUN_NOW);

    CURL_TRC_CF(data_s, cf, "[%d] status: HTTP/2 %03d",
                stream->id, stream->status_code);
    return 0;
  }

  /* nghttp2 guarantees that namelen > 0, and :status was already
     received, and this is not pseudo-header field . */
  /* convert to an HTTP1-style header */
  result = recvbuf_write_hds(cf, data_s, (const char *)name, namelen);
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  result = recvbuf_write_hds(cf, data_s, STRCONST(": "));
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  result = recvbuf_write_hds(cf, data_s, (const char *)value, valuelen);
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  result = recvbuf_write_hds(cf, data_s, STRCONST("\r\n"));
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  /* if we receive data for another handle, wake that up */
  if(CF_DATA_CURRENT(cf) != data_s)
    Curl_expire(data_s, 0, EXPIRE_RUN_NOW);

  CURL_TRC_CF(data_s, cf, "[%d] header: %.*s: %.*s",
              stream->id, (int)namelen, name, (int)valuelen, value);

  return 0; /* 0 is successful */
}